

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkcs8_x509.cc
# Opt level: O2

int PKCS12_handle_safe_bag(CBS *safe_bag,pkcs12_context *ctx)

{
  int iVar1;
  int iVar2;
  X509 *x;
  EVP_PKEY *pkey;
  size_t sVar3;
  uint8_t *friendly_name;
  size_t friendly_name_len;
  uint32_t local_11c;
  CBS cert;
  CBS wrapped_value;
  CBS local_f8;
  uint8_t *inp;
  CBS attr;
  CBS cert_bag;
  CBS bag_id;
  CBS value;
  CBS values;
  CBS wrapped_cert;
  CBS cert_type;
  CBS oid;
  CBB cbb;
  
  iVar1 = CBS_get_asn1(safe_bag,&bag_id,6);
  if ((iVar1 == 0) || (iVar1 = CBS_get_asn1(safe_bag,&wrapped_value,0xa0000000), iVar1 == 0)) {
    iVar1 = 100;
    iVar2 = 0x148;
  }
  else {
    if (safe_bag->len == 0) {
      local_f8.data = (uint8_t *)0x0;
      local_f8.len = 0;
    }
    else {
      iVar1 = CBS_get_asn1(safe_bag,&local_f8,0x20000011);
      if ((iVar1 == 0) || (safe_bag->len != 0)) {
        iVar1 = 100;
        iVar2 = 0x14f;
        goto LAB_003ffc92;
      }
    }
    iVar1 = CBS_mem_equal(&bag_id,kKeyBag,0xb);
    iVar2 = CBS_mem_equal(&bag_id,kPKCS8ShroudedKeyBag,0xb);
    if (iVar2 == 0 && iVar1 == 0) {
      iVar1 = CBS_mem_equal(&bag_id,kCertBag,0xb);
      if (iVar1 == 0) {
        return 1;
      }
      iVar1 = CBS_get_asn1(&wrapped_value,&cert_bag,0x20000010);
      if ((((iVar1 == 0) || (iVar1 = CBS_get_asn1(&cert_bag,&cert_type,6), iVar1 == 0)) ||
          (iVar1 = CBS_get_asn1(&cert_bag,&wrapped_cert,0xa0000000), iVar1 == 0)) ||
         (iVar1 = CBS_get_asn1(&wrapped_cert,&cert,4), iVar1 == 0)) {
        iVar1 = 100;
        iVar2 = 0x177;
      }
      else {
        iVar1 = CBS_mem_equal(&cert_type,kX509Certificate,10);
        if (iVar1 == 0) {
          return 1;
        }
        if ((long)cert.len < 0) {
          iVar1 = 100;
          iVar2 = 0x182;
        }
        else {
          inp = cert.data;
          x = d2i_X509((X509 **)0x0,&inp,cert.len);
          if (x != (X509 *)0x0) {
            if (inp != cert.data + cert.len) {
              ERR_put_error(0x13,0,100,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs8_x509.cc"
                            ,0x18e);
              X509_free(x);
              return 0;
            }
            friendly_name = (uint8_t *)0x0;
            friendly_name_len = 0;
            do {
              do {
                if (local_f8.len == 0) {
                  if (friendly_name_len == 0) {
                    OPENSSL_free(friendly_name);
                  }
                  else {
                    iVar1 = X509_alias_set1(x,friendly_name,(int)friendly_name_len);
                    OPENSSL_free(friendly_name);
                    if (iVar1 == 0) goto LAB_004000bd;
                  }
                  sVar3 = OPENSSL_sk_push((OPENSSL_STACK *)ctx->out_certs,x);
                  if (sVar3 != 0) {
                    return 1;
                  }
                  goto LAB_004000bd;
                }
                iVar1 = CBS_get_asn1(&local_f8,&attr,0x20000010);
                if (((iVar1 == 0) || (iVar1 = CBS_get_asn1(&attr,&oid,6), iVar1 == 0)) ||
                   ((iVar1 = CBS_get_asn1(&attr,&values,0x20000011), iVar1 == 0 || (attr.len != 0)))
                   ) {
                  iVar1 = 0x118;
LAB_004000a2:
                  ERR_put_error(0x13,0,100,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs8_x509.cc"
                                ,iVar1);
                  goto LAB_004000a7;
                }
                iVar1 = CBS_mem_equal(&oid,kFriendlyName,9);
              } while (iVar1 == 0);
              if (((friendly_name != (uint8_t *)0x0) ||
                  (iVar1 = CBS_get_asn1(&values,&value,0x1e), iVar1 == 0)) ||
                 ((values.len != 0 || (value.len == 0)))) {
                iVar1 = 0x121;
                goto LAB_004000a2;
              }
              iVar1 = CBB_init(&cbb,value.len);
              if (iVar1 == 0) goto LAB_004000a7;
              while (value.len != 0) {
                iVar1 = CBS_get_ucs2_be(&value,&local_11c);
                if ((iVar1 == 0) || (iVar1 = CBB_add_utf8(&cbb,local_11c), iVar1 == 0)) {
                  ERR_put_error(0x13,0,0x83,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs8_x509.cc"
                                ,300);
                  goto LAB_00400067;
                }
              }
              iVar1 = CBB_finish(&cbb,&friendly_name,&friendly_name_len);
            } while (iVar1 != 0);
LAB_00400067:
            CBB_cleanup(&cbb);
LAB_004000a7:
            OPENSSL_free(friendly_name);
            friendly_name = (uint8_t *)0x0;
            friendly_name_len = 0;
LAB_004000bd:
            X509_free(x);
            return 0;
          }
          iVar1 = 100;
          iVar2 = 0x189;
        }
      }
    }
    else {
      if (*ctx->out_key == (EVP_PKEY *)0x0) {
        if (iVar1 == 0) {
          pkey = (EVP_PKEY *)
                 PKCS8_parse_encrypted_private_key(&wrapped_value,ctx->password,ctx->password_len);
        }
        else {
          pkey = (EVP_PKEY *)EVP_parse_private_key(&wrapped_value);
        }
        if (pkey == (EVP_PKEY *)0x0) {
          return 0;
        }
        if (wrapped_value.len == 0) {
          *ctx->out_key = (EVP_PKEY *)pkey;
          return 1;
        }
        ERR_put_error(0x13,0,100,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs8_x509.cc"
                      ,0x166);
        EVP_PKEY_free(pkey);
        return 0;
      }
      iVar1 = 0x71;
      iVar2 = 0x159;
    }
  }
LAB_003ffc92:
  ERR_put_error(0x13,0,iVar1,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs8_x509.cc"
                ,iVar2);
  return 0;
}

Assistant:

static int PKCS12_handle_safe_bag(CBS *safe_bag, struct pkcs12_context *ctx) {
  CBS bag_id, wrapped_value, bag_attrs;
  if (!CBS_get_asn1(safe_bag, &bag_id, CBS_ASN1_OBJECT) ||
      !CBS_get_asn1(safe_bag, &wrapped_value,
                    CBS_ASN1_CONTEXT_SPECIFIC | CBS_ASN1_CONSTRUCTED | 0)) {
    OPENSSL_PUT_ERROR(PKCS8, PKCS8_R_BAD_PKCS12_DATA);
    return 0;
  }
  if (CBS_len(safe_bag) == 0) {
    CBS_init(&bag_attrs, NULL, 0);
  } else if (!CBS_get_asn1(safe_bag, &bag_attrs, CBS_ASN1_SET) ||
             CBS_len(safe_bag) != 0) {
    OPENSSL_PUT_ERROR(PKCS8, PKCS8_R_BAD_PKCS12_DATA);
    return 0;
  }

  const int is_key_bag = CBS_mem_equal(&bag_id, kKeyBag, sizeof(kKeyBag));
  const int is_shrouded_key_bag = CBS_mem_equal(&bag_id, kPKCS8ShroudedKeyBag,
                                                sizeof(kPKCS8ShroudedKeyBag));
  if (is_key_bag || is_shrouded_key_bag) {
    // See RFC 7292, section 4.2.1 and 4.2.2.
    if (*ctx->out_key) {
      OPENSSL_PUT_ERROR(PKCS8, PKCS8_R_MULTIPLE_PRIVATE_KEYS_IN_PKCS12);
      return 0;
    }

    EVP_PKEY *pkey =
        is_key_bag ? EVP_parse_private_key(&wrapped_value)
                   : PKCS8_parse_encrypted_private_key(
                         &wrapped_value, ctx->password, ctx->password_len);
    if (pkey == NULL) {
      return 0;
    }

    if (CBS_len(&wrapped_value) != 0) {
      OPENSSL_PUT_ERROR(PKCS8, PKCS8_R_BAD_PKCS12_DATA);
      EVP_PKEY_free(pkey);
      return 0;
    }

    *ctx->out_key = pkey;
    return 1;
  }

  if (CBS_mem_equal(&bag_id, kCertBag, sizeof(kCertBag))) {
    // See RFC 7292, section 4.2.3.
    CBS cert_bag, cert_type, wrapped_cert, cert;
    if (!CBS_get_asn1(&wrapped_value, &cert_bag, CBS_ASN1_SEQUENCE) ||
        !CBS_get_asn1(&cert_bag, &cert_type, CBS_ASN1_OBJECT) ||
        !CBS_get_asn1(&cert_bag, &wrapped_cert,
                      CBS_ASN1_CONTEXT_SPECIFIC | CBS_ASN1_CONSTRUCTED | 0) ||
        !CBS_get_asn1(&wrapped_cert, &cert, CBS_ASN1_OCTETSTRING)) {
      OPENSSL_PUT_ERROR(PKCS8, PKCS8_R_BAD_PKCS12_DATA);
      return 0;
    }

    // Skip unknown certificate types.
    if (!CBS_mem_equal(&cert_type, kX509Certificate,
                       sizeof(kX509Certificate))) {
      return 1;
    }

    if (CBS_len(&cert) > LONG_MAX) {
      OPENSSL_PUT_ERROR(PKCS8, PKCS8_R_BAD_PKCS12_DATA);
      return 0;
    }

    const uint8_t *inp = CBS_data(&cert);
    X509 *x509 = d2i_X509(NULL, &inp, (long)CBS_len(&cert));
    if (!x509) {
      OPENSSL_PUT_ERROR(PKCS8, PKCS8_R_BAD_PKCS12_DATA);
      return 0;
    }

    if (inp != CBS_data(&cert) + CBS_len(&cert)) {
      OPENSSL_PUT_ERROR(PKCS8, PKCS8_R_BAD_PKCS12_DATA);
      X509_free(x509);
      return 0;
    }

    uint8_t *friendly_name;
    size_t friendly_name_len;
    if (!parse_bag_attributes(&bag_attrs, &friendly_name, &friendly_name_len)) {
      X509_free(x509);
      return 0;
    }
    int ok = friendly_name_len == 0 ||
             X509_alias_set1(x509, friendly_name, friendly_name_len);
    OPENSSL_free(friendly_name);
    if (!ok || 0 == sk_X509_push(ctx->out_certs, x509)) {
      X509_free(x509);
      return 0;
    }

    return 1;
  }

  // Unknown element type - ignore it.
  return 1;
}